

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_pipeline.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *object;
  Task *pTVar2;
  Executor *this;
  undefined1 *puVar3;
  size_t i_1;
  Task stop;
  Task task;
  Task init;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  pl;
  size_t i;
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  pipes;
  anon_class_8_1_4eff857e pipe_callable;
  array<unsigned_long,_4UL> buffer;
  size_t num_lines;
  Executor executor;
  Taskflow taskflow;
  string *in_stack_fffffffffffffa98;
  Taskflow *in_stack_fffffffffffffaa0;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *this_00;
  PipeType *in_stack_fffffffffffffaa8;
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  *in_stack_fffffffffffffab0;
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  *this_01;
  string *in_stack_fffffffffffffab8;
  Taskflow *in_stack_fffffffffffffac0;
  allocator<char> *in_stack_fffffffffffffad0;
  Executor *this_02;
  char *in_stack_fffffffffffffad8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  last;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  first;
  __basic_future<void> local_508 [2];
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *local_4e8;
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *local_4e0;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *in_stack_fffffffffffffb30;
  ulong uVar4;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  in_stack_fffffffffffffb38;
  __normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>
  in_stack_fffffffffffffb40;
  undefined1 local_4a1 [41];
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffb88;
  Task in_stack_fffffffffffffb90;
  Executor *in_stack_fffffffffffffb98;
  string local_460 [40];
  Task local_438;
  undefined1 local_429 [49];
  Task local_3f8;
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *local_3f0;
  Pipe<std::function<void_(tf::Pipeflow_&)>_> *local_3e8;
  undefined4 local_2a4;
  ulong local_2a0;
  undefined1 local_298 [88];
  undefined1 local_240 [335];
  undefined1 local_f1 [237];
  int local_4;
  
  local_4 = 0;
  first._M_current = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  uVar1 = std::thread::hardware_concurrency();
  object = (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
            *)(ulong)uVar1;
  last._M_current = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)(local_298 + 0x48);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffb98,(size_t)in_stack_fffffffffffffb90._node,
             in_stack_fffffffffffffb88);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x105938);
  local_298._64_8_ = (pointer)0x4;
  local_298._24_8_ = local_298 + 0x20;
  std::
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ::vector((vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
            *)0x105961);
  for (local_2a0 = 0; local_2a0 < 3; local_2a0 = local_2a0 + 1) {
    local_2a4 = 2;
    std::
    vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
    ::emplace_back<tf::PipeType,main::__2&>
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
               (anon_class_8_1_4eff857e *)in_stack_fffffffffffffaa0);
  }
  __s = local_298;
  local_3e8 = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)
              std::
              vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
              ::begin((vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                       *)in_stack_fffffffffffffa98);
  local_3f0 = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)
              std::
              vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
              ::end((vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                     *)in_stack_fffffffffffffa98);
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::ScalablePipeline(in_stack_fffffffffffffb30,
                     CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                     in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_scalable_pipeline_cpp:84:36),_nullptr>
            ((FlowBuilder *)last._M_current,(anon_class_1_0_00000001 *)object);
  this_02 = (Executor *)local_429;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
             (allocator<char> *)this_02);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  tf::Task::Task(&local_3f8,pTVar2);
  std::__cxx11::string::~string((string *)(local_429 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_429);
  tf::FlowBuilder::
  composed_of<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void(tf::Pipeflow&)>>*,std::vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>>>>
            ((FlowBuilder *)last._M_current,object);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
             (allocator<char> *)this_02);
  pTVar2 = tf::Task::name((Task *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  tf::Task::Task(&local_438,pTVar2);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb9f);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_scalable_pipeline_cpp:88:36),_nullptr>
            ((FlowBuilder *)last._M_current,(anon_class_1_0_00000001 *)object);
  this_01 = (vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
             *)local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
             (allocator<char> *)this_02);
  this = (Executor *)tf::Task::name((Task *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  tf::Task::Task((Task *)&stack0xfffffffffffffb90,(Task *)this);
  std::__cxx11::string::~string((string *)(local_4a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4a1);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffaa0,(Task *)in_stack_fffffffffffffa98);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffaa0,(Task *)in_stack_fffffffffffffa98);
  tf::Taskflow::dump(in_stack_fffffffffffffaa0,(ostream *)in_stack_fffffffffffffa98);
  puVar3 = local_240;
  tf::Executor::run(this,in_stack_fffffffffffffaa0);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffb38,puVar3);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffaa0);
  for (uVar4 = 0; uVar4 < 2; uVar4 = uVar4 + 1) {
    std::
    vector<tf::Pipe<std::function<void(tf::Pipeflow&)>>,std::allocator<tf::Pipe<std::function<void(tf::Pipeflow&)>>>>
    ::emplace_back<tf::PipeType,main::__2&>
              (this_01,(PipeType *)this,(anon_class_8_1_4eff857e *)in_stack_fffffffffffffaa0);
  }
  this_00 = (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
             *)local_298;
  local_4e0 = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)
              std::
              vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
              ::begin((vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                       *)in_stack_fffffffffffffa98);
  local_4e8 = (Pipe<std::function<void_(tf::Pipeflow_&)>_> *)
              std::
              vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
              ::end((vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
                     *)in_stack_fffffffffffffa98);
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::reset(object,first,last);
  puVar3 = local_240;
  tf::Executor::run(this,(Taskflow *)this_00);
  std::__basic_future<void>::wait(local_508,puVar3);
  tf::Future<void>::~Future((Future<void> *)this_00);
  local_4 = 0;
  tf::
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  ::~ScalablePipeline(this_00);
  std::
  vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>
  ::~vector(this_01);
  tf::Executor::~Executor(this_02);
  tf::Taskflow::~Taskflow((Taskflow *)this_00);
  return local_4;
}

Assistant:

int main() {

  tf::Taskflow taskflow("pipeline");
  tf::Executor executor;

  const size_t num_lines = 4;

  // create data storage
  std::array<size_t, num_lines> buffer;

  // define the pipe callable
  auto pipe_callable = [&buffer] (tf::Pipeflow& pf) mutable {
    switch(pf.pipe()) {
      // first stage generates only 5 scheduling tokens and saves the
      // token number into the buffer.
      case 0: {
        if(pf.token() == 5) {
          pf.stop();
        }
        else {
          printf("stage 1: input token = %zu\n", pf.token());
          buffer[pf.line()] = pf.token();
        }
        return;
      }
      break;

      // other stages propagate the previous result to this pipe and
      // increment it by one
      default: {
        printf(
          "stage %zu: input buffer[%zu] = %zu\n", pf.pipe(), pf.line(), buffer[pf.line()]
        );
        buffer[pf.line()] = buffer[pf.line()] + 1;
      }
      break;
    }
  };

  // create a vector of three pipes
  std::vector< tf::Pipe<std::function<void(tf::Pipeflow&)>> > pipes;

  for(size_t i=0; i<3; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }

  // create a pipeline of four parallel lines using the given vector of pipes
  tf::ScalablePipeline<decltype(pipes)::iterator> pl(num_lines, pipes.begin(), pipes.end());

  // build the pipeline graph using composition
  tf::Task init = taskflow.emplace([](){ std::cout << "ready\n"; })
                          .name("starting pipeline");
  tf::Task task = taskflow.composed_of(pl)
                          .name("pipeline");
  tf::Task stop = taskflow.emplace([](){ std::cout << "stopped\n"; })
                          .name("pipeline stopped");

  // create task dependency
  init.precede(task);
  task.precede(stop);

  // dump the pipeline graph structure (with composition)
  taskflow.dump(std::cout);

  // run the pipeline
  executor.run(taskflow).wait();

  // reset the pipeline to a new range of five pipes and starts from
  // the initial state (i.e., token counts from zero)
  for(size_t i=0; i<2; i++) {
    pipes.emplace_back(tf::PipeType::SERIAL, pipe_callable);
  }
  pl.reset(pipes.begin(), pipes.end());

  executor.run(taskflow).wait();

  return 0;
}